

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O2

Index __thiscall AgentBG::Act(AgentBG *this,Index oI,Index prevJoI)

{
  size_t sVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  Index IVar3;
  uint uVar4;
  JointBeliefInterface *pJVar5;
  LIndex i;
  MultiAgentDecisionProcessDiscreteInterface *pu;
  JointPolicyPureVector *pJVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  Index local_44;
  Index local_40;
  Index local_3c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_40 = prevJoI;
  local_3c = oI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_m_oIs,&local_3c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_m_prevJoIs,&local_40);
  sVar1 = this->_m_t;
  if (sVar1 == 2) {
    IVar3 = this->_m_jaIfirst;
    pDVar2 = ((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
             _m_DecPOMDP;
    pu = (MultiAgentDecisionProcessDiscreteInterface *)
         ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
LAB_0040fc61:
    JointBeliefSparse::Update(&this->_m_prevJB,pu,IVar3,local_40);
    i = GetMaximizingBGIndex
                  (this,(JointBeliefInterface *)
                        (&(this->_m_prevJB).field_0x0 + *(long *)(*(long *)&this->_m_prevJB + -0xd0)
                        ));
    pJVar6 = this->_m_jpol;
  }
  else {
    if (sVar1 != 1) {
      if (sVar1 == 0) {
        pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                           (&((this->super_AgentDelayedSharedObservations).
                              super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete);
        IVar3 = GetMaximizingActionIndex(this,pJVar5);
        (**(code **)((long)*pJVar5 + 8))(pJVar5);
        PlanningUnitMADPDiscrete::JointToIndividualActionIndices
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
                   &((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)
                    ->super_PlanningUnitMADPDiscrete,IVar3);
        uVar4 = (*(this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
                  super_SimulationAgent._vptr_SimulationAgent[2])(this);
        local_44 = local_38._M_impl.super__Vector_impl_data._M_start[uVar4];
        this->_m_jaIfirst = IVar3;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
        goto LAB_0040fcc2;
      }
      pDVar2 = ((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
               _m_DecPOMDP;
      pu = (MultiAgentDecisionProcessDiscreteInterface *)
           ((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb8));
      IVar3 = (*(this->_m_jpol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                super_JointPolicy._vptr_JointPolicy[0x11])(this->_m_jpol,(ulong)local_40);
      goto LAB_0040fc61;
    }
    pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                       (&((this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
                         _m_pu)->super_PlanningUnitMADPDiscrete);
    i = GetMaximizingBGIndex(this,pJVar5);
    (**(code **)((long)*pJVar5 + 8))(pJVar5);
    pJVar6 = this->_m_jpol;
  }
  JPolComponent_VectorImplementation::SetIndex(&pJVar6->super_JPolComponent_VectorImplementation,i);
  (*(this->_m_jpol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
    _vptr_JointPolicy[7])();
  pJVar6 = this->_m_jpol;
  uVar4 = (*(this->super_AgentDelayedSharedObservations).super_AgentDecPOMDPDiscrete.
            super_SimulationAgent._vptr_SimulationAgent[2])(this);
  local_44 = (*(pJVar6->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
               _vptr_JointPolicy[0x13])(pJVar6,(ulong)uVar4,(ulong)local_3c);
LAB_0040fcc2:
  this->_m_t = this->_m_t + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->_m_aIs,&local_44);
  return local_44;
}

Assistant:

Index AgentBG::Act(Index oI, Index prevJoI)
{
    AlphaVector::BGPolicyIndex betaMaxI=INT_MAX;
    Index aI=INT_MAX;

    _m_oIs.push_back(oI);
    _m_prevJoIs.push_back(prevJoI);

#if DEBUG_AgentBG
//     cout << " oIs "; PrintVectorCout(_m_oIs);
//     cout << " prevJoIs "; PrintVectorCout(_m_prevJoIs);
#endif

    switch(_m_t)
    {
    case 0: // we know joint belief at t=0, namely the ISD, so we can
            // use the POMDP action
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        Index ja=GetMaximizingActionIndex(*jbi);
        delete jbi;
        vector<Index> aIs=GetPU()->JointToIndividualActionIndices(ja);
        aI=aIs[GetIndex()];
        _m_jaIfirst=ja;
#if DEBUG_AgentBG
        cout << GetIndex() << ": ja " << ja << " aI " << aI << endl;
#endif
        break;
    }
    case 1: // at t=1, the previous joint belief is the ISD, but now
            // we use the BG policy
    {
        JointBeliefInterface* jbi = GetPU()->GetNewJointBeliefFromISD();
        betaMaxI=GetMaximizingBGIndex(*jbi);
        delete jbi;

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    case 2: // now we start updating the previous joint beliefs, using
            // the joint action we took at t=0
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jaIfirst,prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    default: // the rest of the time we use the previous BG jpol to
             // get the joint action to update the joint belief
    {
        _m_prevJB.Update(*GetPU()->GetDPOMDPD(),_m_jpol->GetJointActionIndex(prevJoI),
                         prevJoI);

        betaMaxI=GetMaximizingBGIndex(_m_prevJB);

        _m_jpol->SetIndex(betaMaxI);
        _m_jpol->Print();
        aI=_m_jpol->GetActionIndex(GetIndex(),oI);
        break;
    }
    }

    _m_t++;

    _m_aIs.push_back(aI);

#if DEBUG_AgentBG
//     cout << GetIndex() << ": t " << _m_t << " oI " << oI
//          << " prevJoI " << prevJoI << endl;

//     cout << GetIndex() << ":";
//     cout << " prevJaIs "; PrintVectorCout(_m_prevJaIs);
//     cout << " aIs "; PrintVectorCout(_m_aIs);
//     cout << endl;

#endif

    return(aI);
}